

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* __thiscall
Parser::parse_labels
          (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           *__return_storage_ptr__,Parser *this,string *path)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  pointer pvVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  res;
  ifstream f;
  uint local_264 [3];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_258;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_258.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_238,(string *)path,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_238,(long)local_264);
    std::istream::read((char *)local_238,(long)local_264);
    auVar9 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_264[0] >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_264[0] >> 0x10),local_264[0]
                                                          )) >> 0x20),local_264[0]) >> 0x18),
                                       (char)(local_264[0] >> 8)),(ushort)(byte)local_264[0]) &
                     0xffffff00ffffff);
    auVar9 = pshuflw(auVar9,auVar9,0x1b);
    sVar1 = auVar9._0_2_;
    sVar2 = auVar9._2_2_;
    sVar3 = auVar9._4_2_;
    sVar4 = auVar9._6_2_;
    uVar8 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar9[6] - (0xff < sVar4),
                     CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar9[4] - (0xff < sVar3),
                              CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar9[2] - (0xff < sVar2),
                                       (0 < sVar1) * (sVar1 < 0x100) * auVar9[0] - (0xff < sVar1))))
    ;
    local_264[0] = uVar8;
    if ((uVar8 != 10000) && (uVar8 != 60000)) {
      __assert_fail("count1 == 60000 || count1 == 10000",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/utils.cpp"
                    ,0x38,
                    "std::vector<std::vector<float>> Parser::parse_labels(const std::string &)");
    }
    local_240 = __return_storage_ptr__;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::reserve(&local_258,(ulong)uVar8);
    if (0 < (int)uVar8) {
      do {
        local_264[2] = 10;
        local_264[1] = 0;
        std::
        vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>
        ::emplace_back<int,int>
                  ((vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>
                    *)&local_258,(int *)(local_264 + 2),(int *)(local_264 + 1));
        pvVar5 = local_258.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar6 = std::istream::get();
        pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar6] = 1.0;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    std::ifstream::close();
    (local_240->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_258.
         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_240->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_258.
         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_240->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_258.
         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_258.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__ = local_240;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unable to open: ",0x10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::ifstream::~ifstream(local_238);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_258);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<float>> Parser::parse_labels(const std::string& path) {
    using namespace std;
    std::vector<std::vector<float>> res;
    ifstream f(path, ios::binary);
    if (!f) {
        cerr << "unable to open: " << path << endl;
        return {};
    }
    char bytes[4];
    f.read(bytes, 4);
    f.read(bytes, 4);
    Parser::big_to_little(bytes);
    int count1;
    count1 = *(reinterpret_cast<int*>(bytes));

    assert(count1 == 60000 || count1 == 10000);
    res.reserve(count1);
    for (int i = 0; i < count1; ++i) {
        res.emplace_back(10, 0);
        res.back()[f.get()] = 1;
    }
    f.close();
    return res;
}